

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_copy_foreign_object(qpdf_data qpdf,qpdf_data other_qpdf,qpdf_oh foreign_oh)

{
  uint uVar1;
  anon_class_8_1_8990bbdf local_68;
  function<unsigned_int_(QPDFObjectHandle_&)> local_60;
  function<unsigned_int_()> local_40;
  qpdf_oh local_1c;
  qpdf_data p_Stack_18;
  qpdf_oh foreign_oh_local;
  qpdf_data other_qpdf_local;
  qpdf_data qpdf_local;
  
  local_1c = foreign_oh;
  p_Stack_18 = other_qpdf;
  other_qpdf_local = qpdf;
  return_uninitialized(&local_40,qpdf);
  local_68.qpdf = other_qpdf_local;
  std::function<unsigned_int(QPDFObjectHandle&)>::function<qpdf_oh_copy_foreign_object::__0,void>
            ((function<unsigned_int(QPDFObjectHandle&)> *)&local_60,&local_68);
  uVar1 = do_with_oh<unsigned_int>(other_qpdf,foreign_oh,&local_40,&local_60);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<unsigned_int_()>::~function(&local_40);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_copy_foreign_object(qpdf_data qpdf, qpdf_data other_qpdf, qpdf_oh foreign_oh)
{
    return do_with_oh<qpdf_oh>(
        other_qpdf, foreign_oh, return_uninitialized(qpdf), [qpdf](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_copy_foreign_object");
            return new_object(qpdf, qpdf->qpdf->copyForeignObject(o));
        });
}